

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

void av1_find_mv_refs(AV1_COMMON *cm,MACROBLOCKD *xd,MB_MODE_INFO *mi,MV_REFERENCE_FRAME ref_frame,
                     uint8_t *ref_mv_count,CANDIDATE_MV (*ref_mv_stack) [8],
                     uint16_t (*ref_mv_weight) [8],int_mv (*mv_ref_list) [2],int_mv *global_mvs,
                     int16_t *mode_context)

{
  char in_CL;
  undefined1 *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  undefined4 *in_stack_00000018;
  MV_REFERENCE_FRAME rf [2];
  int force_integer_mv;
  int allow_high_precision_mv;
  BLOCK_SIZE bsize;
  int_mv gm_mv [2];
  int mi_col;
  int mi_row;
  uint16_t *in_stack_00000120;
  CANDIDATE_MV *in_stack_00000128;
  uint8_t *in_stack_00000130;
  MV_REFERENCE_FRAME in_stack_0000013f;
  MACROBLOCKD *in_stack_00000140;
  AV1_COMMON *in_stack_00000148;
  int_mv *in_stack_00000180;
  int_mv *in_stack_00000188;
  int in_stack_00000190;
  int in_stack_00000198;
  int16_t *in_stack_000001a0;
  int in_stack_ffffffffffffff44;
  undefined8 in_stack_ffffffffffffff48;
  BLOCK_SIZE in_stack_ffffffffffffff53;
  int in_stack_ffffffffffffff54;
  WarpedMotionParams *in_stack_ffffffffffffff58;
  MV_REFERENCE_FRAME local_62 [2];
  int_mv local_60;
  uint local_5c;
  uint local_58;
  undefined1 local_51;
  int_mv local_50;
  int_mv local_4c;
  undefined4 local_48;
  undefined4 local_44;
  char local_29;
  
  local_44 = *in_RSI;
  local_48 = in_RSI[1];
  if (in_CL == '\0') {
    local_4c.as_int = 0;
    local_50.as_int = 0;
    if (in_stack_00000018 != (undefined4 *)0x0) {
      *in_stack_00000018 = 0x80008000;
    }
  }
  else {
    local_51 = *in_RDX;
    local_58 = (uint)(*(byte *)(in_RDI + 0x1ed) & 1);
    local_5c = (uint)(*(byte *)(in_RDI + 0x1ee) & 1);
    if (in_CL < '\b') {
      local_29 = in_CL;
      local_60 = gm_get_motion_vector
                           (in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                            in_stack_ffffffffffffff53,
                            (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                            (int)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
      local_4c.as_int = 0;
      local_50 = local_60;
      if (in_stack_00000018 != (undefined4 *)0x0) {
        *(int_mv *)(in_stack_00000018 + local_29) = local_60;
      }
    }
    else {
      av1_set_ref_frame(local_62,in_CL);
      local_50 = gm_get_motion_vector
                           (in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                            in_stack_ffffffffffffff53,
                            (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                            (int)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
      local_4c = gm_get_motion_vector
                           (in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                            in_stack_ffffffffffffff53,
                            (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                            (int)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
    }
  }
  setup_ref_mv_list(in_stack_00000148,in_stack_00000140,in_stack_0000013f,in_stack_00000130,
                    in_stack_00000128,in_stack_00000120,in_stack_00000180,in_stack_00000188,
                    in_stack_00000190,in_stack_00000198,in_stack_000001a0);
  return;
}

Assistant:

void av1_find_mv_refs(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                      MB_MODE_INFO *mi, MV_REFERENCE_FRAME ref_frame,
                      uint8_t ref_mv_count[MODE_CTX_REF_FRAMES],
                      CANDIDATE_MV ref_mv_stack[][MAX_REF_MV_STACK_SIZE],
                      uint16_t ref_mv_weight[][MAX_REF_MV_STACK_SIZE],
                      int_mv mv_ref_list[][MAX_MV_REF_CANDIDATES],
                      int_mv *global_mvs, int16_t *mode_context) {
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  int_mv gm_mv[2];

  if (ref_frame == INTRA_FRAME) {
    gm_mv[0].as_int = gm_mv[1].as_int = 0;
    if (global_mvs != NULL) {
      global_mvs[ref_frame].as_int = INVALID_MV;
    }
  } else {
    const BLOCK_SIZE bsize = mi->bsize;
    const int allow_high_precision_mv = cm->features.allow_high_precision_mv;
    const int force_integer_mv = cm->features.cur_frame_force_integer_mv;
    if (ref_frame < REF_FRAMES) {
      gm_mv[0] = gm_get_motion_vector(&cm->global_motion[ref_frame],
                                      allow_high_precision_mv, bsize, mi_col,
                                      mi_row, force_integer_mv);
      gm_mv[1].as_int = 0;
      if (global_mvs != NULL) global_mvs[ref_frame] = gm_mv[0];
    } else {
      MV_REFERENCE_FRAME rf[2];
      av1_set_ref_frame(rf, ref_frame);
      gm_mv[0] = gm_get_motion_vector(&cm->global_motion[rf[0]],
                                      allow_high_precision_mv, bsize, mi_col,
                                      mi_row, force_integer_mv);
      gm_mv[1] = gm_get_motion_vector(&cm->global_motion[rf[1]],
                                      allow_high_precision_mv, bsize, mi_col,
                                      mi_row, force_integer_mv);
    }
  }

  setup_ref_mv_list(cm, xd, ref_frame, &ref_mv_count[ref_frame],
                    ref_mv_stack[ref_frame], ref_mv_weight[ref_frame],
                    mv_ref_list ? mv_ref_list[ref_frame] : NULL, gm_mv, mi_row,
                    mi_col, mode_context);
}